

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

int CECoordinates::ICRS2Observed
              (double ra,double dec,double *az,double *zen,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type,double wavelength,double *observed_ra,double *observed_dec,
              double *hour_angle)

{
  int iVar1;
  double *zen_00;
  double julian_date;
  double longitude;
  double latitude;
  double elevation_m;
  double pressure_hPa;
  double temperature_celsius;
  double relative_humidity;
  double dut1;
  double xp;
  double yp;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  double local_b8;
  double local_b0;
  double local_48;
  double local_40;
  double local_38;
  
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  zen_00 = observed_ra;
  if (observed_ra == (double *)0x0) {
    zen_00 = &local_38;
  }
  if (observed_dec == (double *)0x0) {
    observed_dec = &local_40;
  }
  if (hour_angle == (double *)0x0) {
    hour_angle = &local_48;
  }
  local_b8 = ra;
  local_b0 = dec;
  if (*angle_type == DEGREES) {
    local_b8 = ra * 0.017453292519943295;
    local_b0 = dec * 0.017453292519943295;
  }
  (*date->_vptr_CEDate[4])(date);
  longitude = CEObserver::Longitude_Rad(observer);
  latitude = CEObserver::Latitude_Rad(observer);
  elevation_m = CEObserver::Elevation_m(observer);
  pressure_hPa = CEObserver::Pressure_hPa(observer);
  temperature_celsius = CEObserver::Temperature_C(observer);
  relative_humidity = CEObserver::RelativeHumidity(observer);
  dut1 = CEDate::dut1(date);
  xp = CEDate::xpolar(date);
  yp = CEDate::ypolar(date);
  iVar1 = ICRS2Observed((CECoordinates *)az,local_b8,local_b0,zen,zen_00,julian_date,longitude,
                        latitude,elevation_m,pressure_hPa,temperature_celsius,relative_humidity,dut1
                        ,xp,yp,wavelength,observed_dec,hour_angle,observed_ra);
  if (*angle_type == DEGREES) {
    *az = *az * 57.29577951308232;
    *zen = *zen * 57.29577951308232;
    *zen_00 = *zen_00 * 57.29577951308232;
    *observed_dec = *observed_dec * 57.29577951308232;
    *hour_angle = *hour_angle * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::ICRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type,
                                 double wavelength,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // If values were not passed, point them at the temporary ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;

    // If we've passed in angles that are in degrees we need to convert to radians
    if (angle_type == CEAngleType::DEGREES) {
        ra  *= DD2R ;
        dec *= DD2R ;
    }

    // Call the necessary sofa method
    int err_code = ICRS2Observed(ra, dec,
                                 az, zen,
                                 date.JD(),
                                 observer.Longitude_Rad(),
                                 observer.Latitude_Rad(),
                                 observer.Elevation_m(),
                                 observer.Pressure_hPa(),
                                 observer.Temperature_C(),
                                 observer.RelativeHumidity(),
                                 date.dut1(),
                                 date.xpolar(),
                                 date.ypolar(),
                                 wavelength,
                                 observed_ra, observed_dec, hour_angle) ;

    // Now convert back to degrees if that's what we were passed
    if (angle_type == CEAngleType::DEGREES) {
        *az           *= DR2D ;
        *zen          *= DR2D ;
        *observed_ra  *= DR2D ;
        *observed_dec *= DR2D ;
        *hour_angle   *= DR2D ;
    }
    
    return err_code ;
}